

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  ulong uVar1;
  ulong local_378;
  ulong local_370;
  size_t use_len;
  size_t buf_len;
  int j;
  int i;
  mbedtls_aes_context aes_ctx;
  uchar *iv;
  uchar *p;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  uchar buf [416];
  size_t data_len_local;
  uchar *data_local;
  uchar *output_local;
  
  if (data_len < 0x181) {
    buf._408_8_ = data_len;
    memset(tmp + 0x28,0,0x1a0);
    mbedtls_aes_init((mbedtls_aes_context *)&j);
    buf[8] = SUB81(buf._408_8_,3);
    buf[9] = SUB81(buf._408_8_,2);
    buf[10] = SUB81(buf._408_8_,1);
    buf[0xb] = (uchar)buf._408_8_;
    buf[0xf] = '0';
    memcpy(buf + 0x10,data,buf._408_8_);
    (buf + 0x10)[buf._408_8_] = 0x80;
    uVar1 = buf._408_8_ + 0x19;
    for (buf_len._4_4_ = 0; buf_len._4_4_ < 0x20; buf_len._4_4_ = buf_len._4_4_ + 1) {
      chain[(long)buf_len._4_4_ + 8] = (uchar)buf_len._4_4_;
    }
    mbedtls_aes_setkey_enc((mbedtls_aes_context *)&j,chain + 8,0x100);
    for (buf_len._0_4_ = 0; (int)buf_len < 0x30; buf_len._0_4_ = (int)buf_len + 0x10) {
      iv = tmp + 0x28;
      memset(&p,0,0x10);
      local_370 = uVar1;
      while (local_370 != 0) {
        for (buf_len._4_4_ = 0; buf_len._4_4_ < 0x10; buf_len._4_4_ = buf_len._4_4_ + 1) {
          chain[(long)buf_len._4_4_ + -8] = chain[(long)buf_len._4_4_ + -8] ^ iv[buf_len._4_4_];
        }
        iv = iv + 0x10;
        if (local_370 < 0x10) {
          local_378 = local_370;
        }
        else {
          local_378 = 0x10;
        }
        local_370 = local_370 - local_378;
        mbedtls_aes_crypt_ecb((mbedtls_aes_context *)&j,1,(uchar *)&p,(uchar *)&p);
      }
      *(uchar **)(key + (long)(int)buf_len + 0x18) = p;
      *(undefined8 *)(tmp + (int)buf_len) = chain._0_8_;
      tmp[0x2b] = tmp[0x2b] + '\x01';
    }
    mbedtls_aes_setkey_enc((mbedtls_aes_context *)&j,key + 0x18,0x100);
    aes_ctx.buf._264_8_ = tmp + 0x18;
    iv = output;
    for (buf_len._0_4_ = 0; (int)buf_len < 0x30; buf_len._0_4_ = (int)buf_len + 0x10) {
      mbedtls_aes_crypt_ecb
                ((mbedtls_aes_context *)&j,1,(uchar *)aes_ctx.buf._264_8_,
                 (uchar *)aes_ctx.buf._264_8_);
      *(undefined8 *)iv = *(undefined8 *)aes_ctx.buf._264_8_;
      *(undefined8 *)(iv + 8) = *(undefined8 *)(aes_ctx.buf._264_8_ + 8);
      iv = iv + 0x10;
    }
    mbedtls_aes_free((mbedtls_aes_context *)&j);
    output_local._4_4_ = 0;
  }
  else {
    output_local._4_4_ = -0x38;
  }
  return output_local._4_4_;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS );

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain );
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS );
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    mbedtls_aes_free( &aes_ctx );

    return( 0 );
}